

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_between.cpp
# Opt level: O0

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundBetweenExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  Vector *result_00;
  Vector *left;
  long in_RSI;
  LogicalType *in_RDI;
  Vector intermediate2;
  Vector intermediate1;
  value_type *upper;
  value_type *lower;
  value_type *input;
  idx_t __n;
  vector<duckdb::Vector,_true> *in_stack_fffffffffffffe70;
  Vector *right;
  LogicalTypeId id;
  undefined1 *capacity;
  LogicalType *in_stack_fffffffffffffea8;
  Vector *in_stack_fffffffffffffeb0;
  DataChunk *in_stack_fffffffffffffed0;
  Vector *in_stack_ffffffffffffff38;
  idx_t in_stack_ffffffffffffff40;
  SelectionVector *in_stack_ffffffffffffff48;
  ExpressionState *in_stack_ffffffffffffff50;
  Expression *in_stack_ffffffffffffff58;
  ExpressionExecutor *in_stack_ffffffffffffff60;
  
  DataChunk::Reset(in_stack_fffffffffffffed0);
  __n = 0;
  vector<duckdb::Vector,_true>::operator[](in_stack_fffffffffffffe70,0);
  right = (Vector *)0x1;
  vector<duckdb::Vector,_true>::operator[](in_stack_fffffffffffffe70,__n);
  id = INVALID;
  vector<duckdb::Vector,_true>::operator[](in_stack_fffffffffffffe70,__n);
  result_00 = (Vector *)
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe70);
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                *)result_00,__n);
  ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
            ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> *)
             result_00);
  Execute(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  left = (Vector *)
         unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
                    )result_00);
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                *)result_00,__n);
  ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
            ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> *)
             result_00);
  Execute(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             result_00);
  vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
                *)result_00,__n);
  ::std::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>::get
            ((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_> *)
             result_00);
  Execute(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
          in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  capacity = &stack0xffffffffffffff38;
  LogicalType::LogicalType(in_RDI,id);
  Vector::Vector(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(idx_t)capacity);
  LogicalType::~LogicalType((LogicalType *)0x2e1c692);
  LogicalType::LogicalType(in_RDI,id);
  Vector::Vector(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(idx_t)capacity);
  LogicalType::~LogicalType((LogicalType *)0x2e1c6c3);
  if (((*(byte *)(in_RSI + 0x71) & 1) == 0) || ((*(byte *)(in_RSI + 0x70) & 1) == 0)) {
    if ((*(byte *)(in_RSI + 0x70) & 1) == 0) {
      if ((*(byte *)(in_RSI + 0x71) & 1) == 0) {
        VectorOperations::GreaterThan(left,right,result_00,__n);
        VectorOperations::LessThan(left,right,result_00,__n);
      }
      else {
        VectorOperations::GreaterThan(left,right,result_00,__n);
        VectorOperations::LessThanEquals(left,right,result_00,__n);
      }
    }
    else {
      VectorOperations::GreaterThanEquals(left,right,result_00,__n);
      VectorOperations::LessThan(left,right,result_00,__n);
    }
  }
  else {
    VectorOperations::GreaterThanEquals(left,right,result_00,__n);
    VectorOperations::LessThanEquals(left,right,result_00,__n);
  }
  VectorOperations::And(left,right,result_00,__n);
  Vector::~Vector(result_00);
  Vector::~Vector(result_00);
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundBetweenExpression &expr, ExpressionState *state, const SelectionVector *sel,
                                 idx_t count, Vector &result) {
	// resolve the children
	state->intermediate_chunk.Reset();

	auto &input = state->intermediate_chunk.data[0];
	auto &lower = state->intermediate_chunk.data[1];
	auto &upper = state->intermediate_chunk.data[2];

	Execute(*expr.input, state->child_states[0].get(), sel, count, input);
	Execute(*expr.lower, state->child_states[1].get(), sel, count, lower);
	Execute(*expr.upper, state->child_states[2].get(), sel, count, upper);

	Vector intermediate1(LogicalType::BOOLEAN);
	Vector intermediate2(LogicalType::BOOLEAN);

	if (expr.upper_inclusive && expr.lower_inclusive) {
		VectorOperations::GreaterThanEquals(input, lower, intermediate1, count);
		VectorOperations::LessThanEquals(input, upper, intermediate2, count);
	} else if (expr.lower_inclusive) {
		VectorOperations::GreaterThanEquals(input, lower, intermediate1, count);
		VectorOperations::LessThan(input, upper, intermediate2, count);
	} else if (expr.upper_inclusive) {
		VectorOperations::GreaterThan(input, lower, intermediate1, count);
		VectorOperations::LessThanEquals(input, upper, intermediate2, count);
	} else {
		VectorOperations::GreaterThan(input, lower, intermediate1, count);
		VectorOperations::LessThan(input, upper, intermediate2, count);
	}
	VectorOperations::And(intermediate1, intermediate2, result, count);
}